

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::MixedVertexBindingDivisorCase::test
          (MixedVertexBindingDivisorCase *this,ResultCollector *result)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  CallLogWrapper gl;
  VertexArray vao;
  CallLogWrapper CStack_48;
  ObjectWrapper local_30;
  
  iVar1 = (*((this->super_IndexedCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  glu::CallLogWrapper::CallLogWrapper
            (&CStack_48,(Functions *)CONCAT44(extraout_var,iVar1),
             ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log);
  iVar1 = (*((this->super_IndexedCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  traits = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper(&local_30,(Functions *)CONCAT44(extraout_var_00,iVar1),traits);
  CStack_48.m_enableLog = true;
  glu::CallLogWrapper::glBindVertexArray(&CStack_48,local_30.m_object);
  glu::CallLogWrapper::glVertexAttribDivisor(&CStack_48,1,4);
  gls::StateQueryUtil::verifyStateIndexedInteger
            (result,&CStack_48,0x82d6,1,4,(this->super_IndexedCase).m_verifier);
  glu::ObjectWrapper::~ObjectWrapper(&local_30);
  glu::CallLogWrapper::~CallLogWrapper(&CStack_48);
  return;
}

Assistant:

void MixedVertexBindingDivisorCase::test (tcu::ResultCollector& result)
{
	glu::CallLogWrapper gl					(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	glu::VertexArray	vao					(m_context.getRenderContext());

	gl.enableLogging(true);

	gl.glBindVertexArray(*vao);
	gl.glVertexAttribDivisor(1, 4);
	verifyStateIndexedInteger(result, gl, GL_VERTEX_BINDING_DIVISOR, 1, 4, m_verifier);
}